

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  ulong uVar1;
  size_t sVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint max;
  uint local_34;
  
  local_34 = maxCode;
  HIST_countFast_wksp((uint *)workspace,&local_34,codeTable,nbSeq,workspace,0x22d8);
  if (type == set_rle) {
LAB_0039717b:
    uVar1 = 0;
LAB_0039717d:
    if (0 < (long)nbSeq) {
      pbVar4 = codeTable + nbSeq;
      do {
        pbVar3 = codeTable;
        if (additionalBits != (U8 *)0x0) {
          pbVar3 = additionalBits + *codeTable;
        }
        uVar1 = uVar1 + *pbVar3;
        codeTable = codeTable + 1;
      } while (codeTable < pbVar4);
    }
    sVar2 = uVar1 >> 3;
  }
  else {
    if (type == set_basic) {
      if (local_34 <= defaultMax) {
        uVar1 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)workspace,local_34);
        goto LAB_0039716c;
      }
    }
    else {
      if ((type & ~set_rle) != set_compressed) goto LAB_0039717b;
      uVar1 = ZSTD_fseBitCost(fseCTable,(uint *)workspace,local_34);
LAB_0039716c:
      if (uVar1 < 0xffffffffffffff89) goto LAB_0039717d;
    }
    sVar2 = nbSeq * 10;
  }
  return sVar2;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U8* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        cSymbolTypeSizeEstimateInBits = max <= defaultMax
                ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max)
                : ERROR(GENERIC);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}